

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.c
# Opt level: O0

int enet_socket_set_option(ENetSocket socket,ENetSocketOption option,int value)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  timeval timeVal_1;
  timeval timeVal;
  int result;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  int local_10;
  undefined1 local_c [12];
  
  local_10 = -1;
  if (in_ESI - 1U < 9 || in_ESI == 10) {
    switch((long)&switchD_0010d801::switchdataD_0010e04c +
           (long)(int)(&switchD_0010d801::switchdataD_0010e04c)[in_ESI - 1U]) {
    case 0x10d803:
      uVar1 = 0;
      if (in_EDX != 0) {
        uVar1 = 0x800;
      }
      uVar2 = fcntl(in_EDI,3);
      local_10 = fcntl(in_EDI,4,(ulong)(uVar1 | uVar2 & 0xfffff7ff));
      break;
    case 0x10d854:
      local_10 = setsockopt(in_EDI,1,6,local_c,4);
      break;
    case 0x10d87b:
      local_10 = setsockopt(in_EDI,1,2,local_c,4);
      break;
    case 0x10d8a2:
      local_10 = setsockopt(in_EDI,1,8,local_c,4);
      break;
    case 0x10d8c9:
      local_10 = setsockopt(in_EDI,1,7,local_c,4);
      break;
    case 0x10d8f0:
      local_20 = (long)(in_EDX / 1000);
      local_18 = (long)((in_EDX % 1000) * 1000);
      local_10 = setsockopt(in_EDI,1,0x14,&local_20,0x10);
      break;
    case 0x10d943:
      local_30 = (long)(in_EDX / 1000);
      local_28 = (long)((in_EDX % 1000) * 1000);
      local_10 = setsockopt(in_EDI,1,0x15,&local_30,0x10);
      break;
    case 0x10d993:
      local_10 = setsockopt(in_EDI,6,1,local_c,4);
      break;
    case 0x10d9b7:
      local_10 = setsockopt(in_EDI,0,2,local_c,4);
      break;
    case 0x10d9d8:
      goto switchD_0010d801_caseD_10d9d8;
    }
  }
  else {
switchD_0010d801_caseD_10d9d8:
  }
  iVar3 = 0;
  if (local_10 == -1) {
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int
enet_socket_set_option (ENetSocket socket, ENetSocketOption option, int value)
{
    int result = -1;
    switch (option)
    {
        case ENET_SOCKOPT_NONBLOCK:
#ifdef HAS_FCNTL
            result = fcntl (socket, F_SETFL, (value ? O_NONBLOCK : 0) | (fcntl (socket, F_GETFL) & ~O_NONBLOCK));
#else
            result = ioctl (socket, FIONBIO, & value);
#endif
            break;

        case ENET_SOCKOPT_BROADCAST:
            result = setsockopt (socket, SOL_SOCKET, SO_BROADCAST, (char *) & value, sizeof (int));
            break;

        case ENET_SOCKOPT_REUSEADDR:
            result = setsockopt (socket, SOL_SOCKET, SO_REUSEADDR, (char *) & value, sizeof (int));
            break;

        case ENET_SOCKOPT_RCVBUF:
            result = setsockopt (socket, SOL_SOCKET, SO_RCVBUF, (char *) & value, sizeof (int));
            break;

        case ENET_SOCKOPT_SNDBUF:
            result = setsockopt (socket, SOL_SOCKET, SO_SNDBUF, (char *) & value, sizeof (int));
            break;

        case ENET_SOCKOPT_RCVTIMEO:
        {
            struct timeval timeVal;
            timeVal.tv_sec = value / 1000;
            timeVal.tv_usec = (value % 1000) * 1000;
            result = setsockopt (socket, SOL_SOCKET, SO_RCVTIMEO, (char *) & timeVal, sizeof (struct timeval));
            break;
        }

        case ENET_SOCKOPT_SNDTIMEO:
        {
            struct timeval timeVal;
            timeVal.tv_sec = value / 1000;
            timeVal.tv_usec = (value % 1000) * 1000;
            result = setsockopt (socket, SOL_SOCKET, SO_SNDTIMEO, (char *) & timeVal, sizeof (struct timeval));
            break;
        }

        case ENET_SOCKOPT_NODELAY:
            result = setsockopt (socket, IPPROTO_TCP, TCP_NODELAY, (char *) & value, sizeof (int));
            break;

        case ENET_SOCKOPT_TTL:
            result = setsockopt (socket, IPPROTO_IP, IP_TTL, (char *) & value, sizeof (int));
            break;

        default:
            break;
    }
    return result == -1 ? -1 : 0;
}